

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O2

int flush_wbuff(archive_write *a)

{
  void *pvVar1;
  int iVar2;
  
  pvVar1 = a->format_data;
  iVar2 = __archive_write_output
                    (a,(void *)((long)pvVar1 + 0x108),0xf000 - *(long *)((long)pvVar1 + 0xf108));
  if (iVar2 == 0) {
    *(undefined8 *)((long)pvVar1 + 0xf108) = 0xf000;
  }
  return iVar2;
}

Assistant:

static int
flush_wbuff(struct archive_write *a)
{
	struct _7zip *zip;
	int r;
	size_t s;

	zip = (struct _7zip *)a->format_data;
	s = sizeof(zip->wbuff) - zip->wbuff_remaining;
	r = __archive_write_output(a, zip->wbuff, s);
	if (r != ARCHIVE_OK)
		return (r);
	zip->wbuff_remaining = sizeof(zip->wbuff);
	return (r);
}